

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshSelectWeights5(word *t,int nVars,int *pW)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  if (nVars != 5) {
    __assert_fail("nVars == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                  ,0xd8,"int Extra_ThreshSelectWeights5(word *, int, int *)");
  }
  uVar3 = 1;
  do {
    pW[4] = uVar3;
    uVar4 = uVar3;
    if (uVar3 == 6) {
      return 0;
    }
    for (; pW[3] = uVar4, uVar5 = uVar4, uVar4 != 6; uVar4 = uVar4 + 1) {
      for (; pW[2] = uVar5, uVar6 = uVar5, uVar5 < 6; uVar5 = uVar5 + 1) {
        for (; pW[1] = uVar6, uVar7 = uVar6, uVar6 < 6; uVar6 = uVar6 + 1) {
          for (; *pW = uVar7, uVar7 < 6; uVar7 = uVar7 + 1) {
            uVar8 = 0;
            iVar10 = 10000;
            iVar9 = 0;
            do {
              if ((int)uVar8 == 0x20) {
                if (iVar9 < iVar10) {
                  return iVar10;
                }
                __assert_fail("Lmax < Lmin",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                              ,0xec,"int Extra_ThreshSelectWeights5(word *, int, int *)");
              }
              uVar1 = t[uVar8 >> 6 & 0x3ffffff];
              iVar2 = Extra_ThreshWeightedSum(pW,5,(int)uVar8);
              if ((uVar1 >> (uVar8 & 0x3f) & 1) == 0) {
                if (iVar9 <= iVar2) {
                  iVar9 = iVar2;
                }
              }
              else if (iVar2 <= iVar10) {
                iVar10 = iVar2;
              }
              uVar8 = uVar8 + 1;
            } while (iVar9 < iVar10);
          }
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights5(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 0;
    assert(nVars == 5);
    for (pW[4] = 1; pW[4] <= Limit; pW[4]++)
        for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
            for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                    for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                        Lmin = 10000;
                        Lmax = 0;
                        for (m = 0; m < nMints; m++) {
                            if (Abc_TtGetBit(t, m))
                                Lmin = Abc_MinInt(Lmin,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            else
                                Lmax = Abc_MaxInt(Lmax,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            if (Lmax >= Lmin)
                                break;
                        }
                        if (m < nMints)
                            continue;
                        assert(Lmax < Lmin);
                        return Lmin;
                    }
    return 0;
}